

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O0

void __thiscall IR::Print::visit(Print *this,Exp *e)

{
  basic_ostream<char,_std::char_traits<char>_> *os;
  int iVar1;
  Expr *pEVar2;
  undefined4 extraout_var;
  string *args;
  Code *code;
  Exp *e_local;
  Print *this_local;
  
  pEVar2 = Exp::expr(e);
  iVar1 = (*pEVar2->_vptr_Expr[5])();
  if ((Code *)CONCAT44(extraout_var,iVar1) != (Code *)0x0) {
    os = this->out;
    args = Code::text_abi_cxx11_((Code *)CONCAT44(extraout_var,iVar1));
    fmt::v7::print<char[6],std::__cxx11::string_const&,char>(os,(char (*) [6])"\t{0};",args);
    std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("!\"unreachable\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/ir-print.cc"
                ,0x3d,"virtual void IR::Print::visit(IR::Exp *)");
}

Assistant:

void Print::visit(IR::Exp* e) {
  if (auto code = e->expr()->asCode()) {
    fmt::print(out, "\t{0};", code->text());
    out << std::endl;
  } else {
    assert(!"unreachable");
  }
}